

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar32;
  bool bVar33;
  long lVar34;
  byte bVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  ulong uVar37;
  byte bVar38;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar39;
  uint uVar40;
  size_t sVar41;
  Primitive *prim;
  bool bVar42;
  ulong uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar58 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar57 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar58 = ZEXT1664(auVar57);
  }
  pSVar39 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar55._4_4_ = fVar1;
  auVar55._0_4_ = fVar1;
  auVar55._8_4_ = fVar1;
  auVar55._12_4_ = fVar1;
  auVar55._16_4_ = fVar1;
  auVar55._20_4_ = fVar1;
  auVar55._24_4_ = fVar1;
  auVar55._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar56._4_4_ = fVar2;
  auVar56._0_4_ = fVar2;
  auVar56._8_4_ = fVar2;
  auVar56._12_4_ = fVar2;
  auVar56._16_4_ = fVar2;
  auVar56._20_4_ = fVar2;
  auVar56._24_4_ = fVar2;
  auVar56._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar59._4_4_ = fVar3;
  auVar59._0_4_ = fVar3;
  auVar59._8_4_ = fVar3;
  auVar59._12_4_ = fVar3;
  auVar59._16_4_ = fVar3;
  auVar59._20_4_ = fVar3;
  auVar59._24_4_ = fVar3;
  auVar59._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar51._4_4_ = uVar4;
  auVar51._0_4_ = uVar4;
  auVar51._8_4_ = uVar4;
  auVar51._12_4_ = uVar4;
  auVar51._16_4_ = uVar4;
  auVar51._20_4_ = uVar4;
  auVar51._24_4_ = uVar4;
  auVar51._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar53._4_4_ = uVar4;
  auVar53._0_4_ = uVar4;
  auVar53._8_4_ = uVar4;
  auVar53._12_4_ = uVar4;
  auVar53._16_4_ = uVar4;
  auVar53._20_4_ = uVar4;
  auVar53._24_4_ = uVar4;
  auVar53._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar44._4_4_ = uVar4;
  auVar44._0_4_ = uVar4;
  auVar44._8_4_ = uVar4;
  auVar44._12_4_ = uVar4;
  auVar44._16_4_ = uVar4;
  auVar44._20_4_ = uVar4;
  auVar44._24_4_ = uVar4;
  auVar44._28_4_ = uVar4;
  bVar33 = false;
  auVar16 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar60 = ZEXT3264(auVar16);
  auVar61 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar16 = vsubps_avx(auVar55,auVar51);
    auVar12 = vsubps_avx(auVar56,auVar53);
    auVar13 = vsubps_avx(auVar59,auVar44);
    auVar54._0_4_ = fVar3 + auVar44._0_4_;
    auVar54._4_4_ = fVar3 + auVar44._4_4_;
    auVar54._8_4_ = fVar3 + auVar44._8_4_;
    auVar54._12_4_ = fVar3 + auVar44._12_4_;
    auVar54._16_4_ = fVar3 + auVar44._16_4_;
    auVar54._20_4_ = fVar3 + auVar44._20_4_;
    auVar54._24_4_ = fVar3 + auVar44._24_4_;
    auVar54._28_4_ = fVar3 + auVar44._28_4_;
    auVar44 = vmulps_avx512vl(auVar51,auVar51);
    auVar57 = auVar58._0_16_;
LAB_01c7ffd5:
    do {
      if (pSVar39 == stack) {
        return bVar33;
      }
      pSVar32 = pSVar39 + -1;
      pSVar39 = pSVar39 + -1;
    } while (auVar58._0_4_ < (float)pSVar32->dist);
    sVar41 = (pSVar39->ptr).ptr;
LAB_01c7fff4:
    while (uVar40 = (uint)sVar41, context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar41 & 8) != 0) goto LAB_01c80514;
      uVar37 = sVar41 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar48._4_4_ = fVar5;
      auVar48._0_4_ = fVar5;
      auVar48._8_4_ = fVar5;
      auVar48._12_4_ = fVar5;
      auVar48._16_4_ = fVar5;
      auVar48._20_4_ = fVar5;
      auVar48._24_4_ = fVar5;
      auVar48._28_4_ = fVar5;
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0x40));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x140),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0x80));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x180),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0xc0));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x120),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0x60));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x160),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0xa0));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x1a0),auVar48,
                                *(undefined1 (*) [32])(uVar37 + 0xe0));
      auVar47 = vmaxps_avx(auVar55,ZEXT1632(auVar26));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar29));
      auVar14 = vsubps_avx(auVar47,auVar55);
      auVar47 = vmaxps_avx(auVar56,ZEXT1632(auVar27));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar30));
      auVar45 = vsubps_avx(auVar47,auVar56);
      auVar47 = vmaxps_avx(auVar59,ZEXT1632(auVar28));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar31));
      auVar47 = vsubps_avx(auVar47,auVar59);
      auVar52._0_4_ =
           auVar47._0_4_ * auVar47._0_4_ +
           auVar45._0_4_ * auVar45._0_4_ + auVar14._0_4_ * auVar14._0_4_;
      auVar52._4_4_ =
           auVar47._4_4_ * auVar47._4_4_ +
           auVar45._4_4_ * auVar45._4_4_ + auVar14._4_4_ * auVar14._4_4_;
      auVar52._8_4_ =
           auVar47._8_4_ * auVar47._8_4_ +
           auVar45._8_4_ * auVar45._8_4_ + auVar14._8_4_ * auVar14._8_4_;
      auVar52._12_4_ =
           auVar47._12_4_ * auVar47._12_4_ +
           auVar45._12_4_ * auVar45._12_4_ + auVar14._12_4_ * auVar14._12_4_;
      auVar52._16_4_ =
           auVar47._16_4_ * auVar47._16_4_ +
           auVar45._16_4_ * auVar45._16_4_ + auVar14._16_4_ * auVar14._16_4_;
      auVar52._20_4_ =
           auVar47._20_4_ * auVar47._20_4_ +
           auVar45._20_4_ * auVar45._20_4_ + auVar14._20_4_ * auVar14._20_4_;
      auVar52._24_4_ =
           auVar47._24_4_ * auVar47._24_4_ +
           auVar45._24_4_ * auVar45._24_4_ + auVar14._24_4_ * auVar14._24_4_;
      auVar52._28_4_ = auVar45._28_4_ + auVar45._28_4_ + auVar14._28_4_;
      uVar24 = vcmpps_avx512vl(ZEXT1632(auVar26),ZEXT1632(auVar29),2);
      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar16,1);
      auVar14._4_4_ = fVar1 + auVar51._4_4_;
      auVar14._0_4_ = fVar1 + auVar51._0_4_;
      auVar14._8_4_ = fVar1 + auVar51._8_4_;
      auVar14._12_4_ = fVar1 + auVar51._12_4_;
      auVar14._16_4_ = fVar1 + auVar51._16_4_;
      auVar14._20_4_ = fVar1 + auVar51._20_4_;
      auVar14._24_4_ = fVar1 + auVar51._24_4_;
      auVar14._28_4_ = fVar1 + auVar51._28_4_;
      uVar18 = vcmpps_avx512vl(ZEXT1632(auVar26),auVar14,6);
      uVar19 = vcmpps_avx512vl(ZEXT1632(auVar30),auVar12,1);
      auVar47._4_4_ = fVar2 + auVar53._4_4_;
      auVar47._0_4_ = fVar2 + auVar53._0_4_;
      auVar47._8_4_ = fVar2 + auVar53._8_4_;
      auVar47._12_4_ = fVar2 + auVar53._12_4_;
      auVar47._16_4_ = fVar2 + auVar53._16_4_;
      auVar47._20_4_ = fVar2 + auVar53._20_4_;
      auVar47._24_4_ = fVar2 + auVar53._24_4_;
      auVar47._28_4_ = fVar2 + auVar53._28_4_;
      uVar20 = vcmpps_avx512vl(ZEXT1632(auVar27),auVar47,6);
      uVar21 = vcmpps_avx512vl(ZEXT1632(auVar31),auVar13,1);
      uVar22 = vcmpps_avx512vl(ZEXT1632(auVar28),auVar54,6);
      bVar38 = ~((byte)uVar20 | (byte)uVar18 | (byte)uVar22 | (byte)uVar23 |
                (byte)uVar19 | (byte)uVar21) & (byte)uVar24;
      uVar43 = (ulong)bVar38;
      if ((uVar40 & 7) == 6) {
        uVar24 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
        uVar23 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar37 + 0x1c0),0xd);
        uVar43 = (ulong)(bVar38 & (byte)uVar24 & (byte)uVar23);
      }
LAB_01c800d3:
      bVar38 = (byte)uVar43;
      if (bVar38 == 0) goto LAB_01c7ffd5;
      auVar47 = *(undefined1 (*) [32])(sVar41 & 0xfffffffffffffff0);
      auVar14 = ((undefined1 (*) [32])(sVar41 & 0xfffffffffffffff0))[1];
      auVar45 = vpternlogd_avx512vl(auVar60._0_32_,auVar52,auVar61._0_32_,0xf8);
      auVar46 = vpcompressd_avx512vl(auVar45);
      auVar50._0_4_ = (uint)(bVar38 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar38 & 1) * auVar45._0_4_
      ;
      bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * auVar45._4_4_;
      bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * auVar45._8_4_;
      bVar42 = (bool)((byte)(uVar43 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * auVar45._12_4_;
      bVar42 = (bool)((byte)(uVar43 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar42 * auVar46._16_4_ | (uint)!bVar42 * auVar45._16_4_;
      bVar42 = (bool)((byte)(uVar43 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar42 * auVar46._20_4_ | (uint)!bVar42 * auVar45._20_4_;
      bVar42 = (bool)((byte)(uVar43 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar42 * auVar46._24_4_ | (uint)!bVar42 * auVar45._24_4_;
      bVar42 = SUB81(uVar43 >> 7,0);
      auVar50._28_4_ = (uint)bVar42 * auVar46._28_4_ | (uint)!bVar42 * auVar45._28_4_;
      auVar45 = vpermt2q_avx512vl(auVar47,auVar50,auVar14);
      sVar41 = auVar45._0_8_;
      bVar38 = bVar38 - 1 & bVar38;
      if (bVar38 != 0) goto LAB_01c8028f;
    }
    if ((sVar41 & 8) == 0) {
      uVar36 = sVar41 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar46._4_4_ = fVar5;
      auVar46._0_4_ = fVar5;
      auVar46._8_4_ = fVar5;
      auVar46._12_4_ = fVar5;
      auVar46._16_4_ = fVar5;
      auVar46._20_4_ = fVar5;
      auVar46._24_4_ = fVar5;
      auVar46._28_4_ = fVar5;
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0x40));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x140),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0x80));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x180),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0xc0));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x120),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0x60));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x160),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0xa0));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x1a0),auVar46,
                                *(undefined1 (*) [32])(uVar36 + 0xe0));
      auVar47 = vmaxps_avx(auVar55,ZEXT1632(auVar26));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar29));
      auVar14 = vsubps_avx(auVar47,auVar55);
      auVar47 = vmaxps_avx(auVar56,ZEXT1632(auVar27));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar30));
      auVar45 = vsubps_avx(auVar47,auVar56);
      auVar47 = vmaxps_avx(auVar59,ZEXT1632(auVar28));
      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar31));
      auVar47 = vsubps_avx(auVar47,auVar59);
      auVar52._0_4_ =
           auVar14._0_4_ * auVar14._0_4_ + auVar45._0_4_ * auVar45._0_4_ +
           auVar47._0_4_ * auVar47._0_4_;
      auVar52._4_4_ =
           auVar14._4_4_ * auVar14._4_4_ + auVar45._4_4_ * auVar45._4_4_ +
           auVar47._4_4_ * auVar47._4_4_;
      auVar52._8_4_ =
           auVar14._8_4_ * auVar14._8_4_ + auVar45._8_4_ * auVar45._8_4_ +
           auVar47._8_4_ * auVar47._8_4_;
      auVar52._12_4_ =
           auVar14._12_4_ * auVar14._12_4_ + auVar45._12_4_ * auVar45._12_4_ +
           auVar47._12_4_ * auVar47._12_4_;
      auVar52._16_4_ =
           auVar14._16_4_ * auVar14._16_4_ + auVar45._16_4_ * auVar45._16_4_ +
           auVar47._16_4_ * auVar47._16_4_;
      auVar52._20_4_ =
           auVar14._20_4_ * auVar14._20_4_ + auVar45._20_4_ * auVar45._20_4_ +
           auVar47._20_4_ * auVar47._20_4_;
      auVar52._24_4_ =
           auVar14._24_4_ * auVar14._24_4_ + auVar45._24_4_ * auVar45._24_4_ +
           auVar47._24_4_ * auVar47._24_4_;
      auVar52._28_4_ = auVar45._28_4_ + 0.0 + auVar47._28_4_;
      uVar43 = vcmpps_avx512vl(auVar52,auVar44,2);
      uVar37 = vcmpps_avx512vl(ZEXT1632(auVar26),ZEXT1632(auVar29),2);
      uVar43 = uVar43 & uVar37;
      if ((uVar40 & 7) == 6) {
        uVar24 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar36 + 0x1c0),0xd);
        uVar23 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
        uVar43 = (ulong)(byte)((byte)uVar24 & (byte)uVar23 & (byte)uVar43);
      }
      goto LAB_01c800d3;
    }
LAB_01c80514:
    lVar34 = (ulong)(uVar40 & 0xf) - 8;
    prim = (Primitive *)(sVar41 & 0xfffffffffffffff0);
    bVar38 = 0;
    while (bVar42 = lVar34 != 0, lVar34 = lVar34 + -1, bVar42) {
      bVar42 = InstanceArrayIntersector1MB::pointQuery(query,context,prim);
      bVar38 = bVar38 | bVar42;
      prim = prim + 1;
    }
    auVar58 = ZEXT1664(auVar57);
    auVar47 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar60 = ZEXT3264(auVar47);
    auVar61 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    if (bVar38 == 0) goto LAB_01c7ffd5;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar51._4_4_ = uVar4;
    auVar51._0_4_ = uVar4;
    auVar51._8_4_ = uVar4;
    auVar51._12_4_ = uVar4;
    auVar51._16_4_ = uVar4;
    auVar51._20_4_ = uVar4;
    auVar51._24_4_ = uVar4;
    auVar51._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar53._4_4_ = uVar4;
    auVar53._0_4_ = uVar4;
    auVar53._8_4_ = uVar4;
    auVar53._12_4_ = uVar4;
    auVar53._16_4_ = uVar4;
    auVar53._20_4_ = uVar4;
    auVar53._24_4_ = uVar4;
    auVar53._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar44._4_4_ = uVar4;
    auVar44._0_4_ = uVar4;
    auVar44._8_4_ = uVar4;
    auVar44._12_4_ = uVar4;
    auVar44._16_4_ = uVar4;
    auVar44._20_4_ = uVar4;
    auVar44._24_4_ = uVar4;
    auVar44._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar58 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar57 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar58 = ZEXT1664(auVar57);
    }
    bVar33 = true;
  } while( true );
LAB_01c8028f:
  auVar45 = vpshufd_avx2(auVar50,0x55);
  vpermt2q_avx512vl(auVar47,auVar45,auVar14);
  auVar46 = vpminsd_avx2(auVar50,auVar45);
  auVar45 = vpmaxsd_avx2(auVar50,auVar45);
  bVar38 = bVar38 - 1 & bVar38;
  if (bVar38 == 0) {
    auVar46 = vpermi2q_avx512vl(auVar46,auVar47,auVar14);
    sVar41 = auVar46._0_8_;
    auVar47 = vpermt2q_avx512vl(auVar47,auVar45,auVar14);
    (pSVar39->ptr).ptr = auVar47._0_8_;
    lVar34 = 8;
    lStack_24e0 = 0x10;
  }
  else {
    auVar17 = vpshufd_avx2(auVar50,0xaa);
    vpermt2q_avx512vl(auVar47,auVar17,auVar14);
    auVar48 = vpminsd_avx2(auVar46,auVar17);
    auVar46 = vpmaxsd_avx2(auVar46,auVar17);
    auVar17 = vpminsd_avx2(auVar45,auVar46);
    auVar46 = vpmaxsd_avx2(auVar45,auVar46);
    bVar38 = bVar38 - 1 & bVar38;
    if (bVar38 == 0) {
      auVar45 = vpermi2q_avx512vl(auVar48,auVar47,auVar14);
      sVar41 = auVar45._0_8_;
      auVar45 = vpermt2q_avx512vl(auVar47,auVar46,auVar14);
      (pSVar39->ptr).ptr = auVar45._0_8_;
      auVar45 = vpermd_avx2(auVar46,auVar52);
      pSVar39->dist = auVar45._0_4_;
      auVar47 = vpermt2q_avx512vl(auVar47,auVar17,auVar14);
      pSVar39[1].ptr.ptr = auVar47._0_8_;
      lStack_24e0 = 0x18;
      lVar34 = lStack_24e0;
      lStack_24e0 = 0x20;
      auVar45 = auVar17;
    }
    else {
      auVar45 = vpshufd_avx2(auVar50,0xff);
      vpermt2q_avx512vl(auVar47,auVar45,auVar14);
      auVar15 = vpminsd_avx2(auVar48,auVar45);
      auVar48 = vpmaxsd_avx2(auVar48,auVar45);
      auVar45 = vpminsd_avx2(auVar17,auVar48);
      auVar48 = vpmaxsd_avx2(auVar17,auVar48);
      auVar17 = vpminsd_avx2(auVar46,auVar48);
      auVar46 = vpmaxsd_avx2(auVar46,auVar48);
      bVar38 = bVar38 - 1 & bVar38;
      if (bVar38 != 0) {
        auVar49 = valignd_avx512vl(auVar50,auVar50,3);
        auVar48 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar50 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar48,auVar15);
        auVar48 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar45 = vpermt2d_avx512vl(auVar50,auVar48,auVar45);
        auVar48 = vpermt2d_avx512vl(auVar45,auVar48,auVar17);
        auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar45 = vpermt2d_avx512vl(auVar48,auVar45,auVar46);
        auVar58 = ZEXT3264(auVar45);
        bVar35 = bVar38;
        do {
          auVar46 = auVar58._0_32_;
          auVar45._8_4_ = 1;
          auVar45._0_8_ = 0x100000001;
          auVar45._12_4_ = 1;
          auVar45._16_4_ = 1;
          auVar45._20_4_ = 1;
          auVar45._24_4_ = 1;
          auVar45._28_4_ = 1;
          auVar45 = vpermd_avx2(auVar45,auVar49);
          auVar49 = valignd_avx512vl(auVar49,auVar49,1);
          vpermt2q_avx512vl(auVar47,auVar49,auVar14);
          bVar35 = bVar35 - 1 & bVar35;
          uVar24 = vpcmpd_avx512vl(auVar45,auVar46,5);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          bVar25 = (byte)uVar24 << 1;
          auVar46 = valignd_avx512vl(auVar46,auVar46,7);
          bVar42 = (bool)((byte)uVar24 & 1);
          bVar7 = (bool)(bVar25 >> 2 & 1);
          bVar8 = (bool)(bVar25 >> 3 & 1);
          bVar9 = (bool)(bVar25 >> 4 & 1);
          bVar10 = (bool)(bVar25 >> 5 & 1);
          bVar11 = (bool)(bVar25 >> 6 & 1);
          auVar58 = ZEXT3264(CONCAT428((uint)(bVar25 >> 7) * auVar46._28_4_ |
                                       (uint)!(bool)(bVar25 >> 7) * auVar45._28_4_,
                                       CONCAT424((uint)bVar11 * auVar46._24_4_ |
                                                 (uint)!bVar11 * auVar45._24_4_,
                                                 CONCAT420((uint)bVar10 * auVar46._20_4_ |
                                                           (uint)!bVar10 * auVar45._20_4_,
                                                           CONCAT416((uint)bVar9 * auVar46._16_4_ |
                                                                     (uint)!bVar9 * auVar45._16_4_,
                                                                     CONCAT412((uint)bVar8 *
                                                                               auVar46._12_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar45._12_4_,
                                                                               CONCAT48((uint)bVar7
                                                                                        * auVar46.
                                                  _8_4_ | (uint)!bVar7 * auVar45._8_4_,
                                                  CONCAT44((uint)bVar42 * auVar46._4_4_ |
                                                           (uint)!bVar42 * auVar45._4_4_,
                                                           auVar45._0_4_))))))));
        } while (bVar35 != 0);
        lVar34 = (ulong)(uint)POPCOUNT((uint)bVar38) + 3;
        while( true ) {
          auVar46 = auVar58._0_32_;
          auVar45 = vpermt2q_avx512vl(auVar47,auVar46,auVar14);
          sVar41 = auVar45._0_8_;
          bVar42 = lVar34 == 0;
          lVar34 = lVar34 + -1;
          if (bVar42) break;
          (pSVar39->ptr).ptr = sVar41;
          auVar45 = vpermd_avx2(auVar46,auVar52);
          pSVar39->dist = auVar45._0_4_;
          auVar45 = valignd_avx512vl(auVar46,auVar46,1);
          auVar58 = ZEXT3264(auVar45);
          pSVar39 = pSVar39 + 1;
        }
        auVar58 = ZEXT1664(auVar57);
        goto LAB_01c7fff4;
      }
      auVar48 = vpermi2q_avx512vl(auVar15,auVar47,auVar14);
      sVar41 = auVar48._0_8_;
      auVar48 = vpermt2q_avx512vl(auVar47,auVar46,auVar14);
      (pSVar39->ptr).ptr = auVar48._0_8_;
      auVar46 = vpermd_avx2(auVar46,auVar52);
      pSVar39->dist = auVar46._0_4_;
      auVar46 = vpermt2q_avx512vl(auVar47,auVar17,auVar14);
      pSVar39[1].ptr.ptr = auVar46._0_8_;
      auVar46 = vpermd_avx2(auVar17,auVar52);
      pSVar39[1].dist = auVar46._0_4_;
      auVar47 = vpermt2q_avx512vl(auVar47,auVar45,auVar14);
      pSVar39[2].ptr.ptr = auVar47._0_8_;
      lVar34 = 0x28;
      lStack_24e0 = 0x30;
    }
  }
  auVar47 = vpermd_avx2(auVar45,auVar52);
  *(int *)((long)&(pSVar39->ptr).ptr + lVar34) = auVar47._0_4_;
  pSVar39 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar39->ptr).ptr + lStack_24e0);
  goto LAB_01c7fff4;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }